

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O1

void writecb(bufferevent *bev,void *ptr)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = nghttp2_session_want_read(*ptr);
  if (iVar3 == 0) {
    iVar3 = nghttp2_session_want_write(*ptr);
    if (iVar3 == 0) {
      uVar1 = bufferevent_get_output(*(undefined8 *)((long)ptr + 0x10));
      lVar2 = evbuffer_get_length(uVar1);
      if (lVar2 == 0) {
        delete_http2_session_data((http2_session_data *)ptr);
        return;
      }
    }
  }
  return;
}

Assistant:

static void writecb(struct bufferevent *bev, void *ptr) {
  http2_session_data *session_data = (http2_session_data *)ptr;
  (void)bev;

  if (nghttp2_session_want_read(session_data->session) == 0 &&
      nghttp2_session_want_write(session_data->session) == 0 &&
      evbuffer_get_length(bufferevent_get_output(session_data->bev)) == 0) {
    delete_http2_session_data(session_data);
  }
}